

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::ReadStringTemplateCallsiteConstant
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function,Var *var)

{
  byte *current_00;
  ScriptContext *scriptContext;
  JavascriptString *pJVar1;
  JavascriptArray *pJVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char16 *local_48;
  LPCWSTR string;
  JavascriptArray *callsite;
  int arrayLength;
  uint32 len;
  
  callsite._0_4_ = 0;
  current_00 = ReadInt32(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                         (int *)&callsite);
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)function);
  EnterPinnedScope(&string);
  string = (LPCWSTR)JavascriptLibrary::CreateArray
                              ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                               (uint32)callsite);
  if (0 < (int)(uint32)callsite) {
    iVar3 = 0;
    do {
      current_00 = ReadStringConstant(this,current_00,function,&local_48,
                                      (uint32 *)((long)&callsite + 4));
      pJVar1 = JavascriptString::NewCopyBuffer(local_48,callsite._4_4_,scriptContext);
      (**(code **)(*(long *)string + 0x358))(string,iVar3,pJVar1,1);
      iVar3 = iVar3 + 1;
    } while (iVar3 < (int)(uint32)callsite);
  }
  pJVar2 = JavascriptLibrary::CreateArray
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,(uint32)callsite);
  if (0 < (int)(uint32)callsite) {
    uVar5 = 0;
    do {
      current_00 = ReadStringConstant(this,current_00,function,&local_48,
                                      (uint32 *)((long)&callsite + 4));
      pJVar1 = JavascriptString::NewCopyBuffer(local_48,callsite._4_4_,scriptContext);
      (*(pJVar2->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])
                (pJVar2,uVar5,pJVar1,1);
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < (int)(uint32)callsite);
  }
  (*(pJVar2->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x38])(pJVar2);
  (**(code **)(*(long *)string + 0xf0))(string,0x12a,pJVar2,0,0,0,0xf);
  (**(code **)(*(long *)string + 0x1c0))();
  *var = string;
  LeavePinnedScope();
  return current_00;
}

Assistant:

const byte* ReadStringTemplateCallsiteConstant(const byte* current, FunctionBody* function, Var& var)
    {
        int arrayLength = 0;
        current = ReadInt32(current, &arrayLength);

        ScriptContext* scriptContext = function->GetScriptContext();

        ENTER_PINNED_SCOPE(Js::JavascriptArray, callsite);
        callsite = scriptContext->GetLibrary()->CreateArray(arrayLength);

        LPCWSTR string;
        uint32 len;
        uint32 rawlen = 0;

        for (int i = 0; i < arrayLength; i++)
        {
            current = ReadStringConstant(current, function, &string, &len);
            JavascriptString* str = JavascriptString::NewCopyBuffer(string, len, scriptContext);
            callsite->SetItemWithAttributes(i, str, PropertyEnumerable);
        }

        JavascriptArray* rawArray = scriptContext->GetLibrary()->CreateArray(arrayLength);

        for (int i = 0; i < arrayLength; i++)
        {
            current = ReadStringConstant(current, function, &string, &len);
            rawlen += len;

            JavascriptString* str = JavascriptString::NewCopyBuffer(string, len, scriptContext);
            rawArray->SetItemWithAttributes(i, str, PropertyEnumerable);
        }

        rawArray->Freeze();
        callsite->SetPropertyWithAttributes(Js::PropertyIds::raw, rawArray, PropertyNone, nullptr);
        callsite->Freeze();

        var = callsite;
        LEAVE_PINNED_SCOPE();

        return current;
    }